

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconsVisitor.cpp
# Opt level: O1

string * __thiscall
OpenMD::ZConsVisitor::toString_abi_cxx11_(string *__return_storage_ptr__,ZConsVisitor *this)

{
  _Base_ptr p_Var1;
  ulong uVar2;
  _Rb_tree_header *p_Var3;
  char buffer [65535];
  char acStack_10038 [65544];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  memcpy(acStack_10038,"------------------------------------------------------------------\n",0x44);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  snprintf(acStack_10038,0xffff,"Visitor name: %s\n",
           (this->super_BaseVisitor).visitorName._M_dataplus._M_p);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  snprintf(acStack_10038,0xffff,"number of zconstraint molecule: %d\n",
           (ulong)(uint)(this->zmolStates_)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  snprintf(acStack_10038,0xffff,"zconstraint tolerance = %lf\n",this->zconsTol_);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  snprintf(acStack_10038,0xffff,"zconstraint sample time = %lf\n",this->zconsTime_);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  snprintf(acStack_10038,0xffff,"zconstraint output filename = %s\n",
           (this->zconsFilename_)._M_dataplus._M_p);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  p_Var1 = (this->zmolStates_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->zmolStates_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var3) {
    uVar2 = 0;
    do {
      snprintf(acStack_10038,0xffff,"zconstraint molecule[%d] = %d\n",uVar2,
               (ulong)p_Var1[1]._M_color);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      uVar2 = (ulong)((int)uVar2 + 1);
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var3);
  }
  memcpy(acStack_10038,"------------------------------------------------------------------\n",0x44);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

const std::string ZConsVisitor::toString() {
    char buffer[65535];
    std::string result;

    snprintf(
        buffer, 65535,
        "------------------------------------------------------------------\n");
    result += buffer;

    snprintf(buffer, 65535, "Visitor name: %s\n", visitorName.c_str());
    result += buffer;

    snprintf(buffer, 65535, "number of zconstraint molecule: %d\n",
             (int)zmolStates_.size());
    result += buffer;

    snprintf(buffer, 65535, "zconstraint tolerance = %lf\n", zconsTol_);
    result += buffer;

    snprintf(buffer, 65535, "zconstraint sample time = %lf\n", zconsTime_);
    result += buffer;

    snprintf(buffer, 65535, "zconstraint output filename = %s\n",
             zconsFilename_.c_str());
    result += buffer;

    std::map<int, ZConsState>::iterator i;
    int j = 0;
    for (i = zmolStates_.begin(); i != zmolStates_.end(); ++i) {
      snprintf(buffer, 65535, "zconstraint molecule[%d] = %d\n", j++, i->first);
      result += buffer;
    }

    snprintf(
        buffer, 65535,
        "------------------------------------------------------------------\n");
    result += buffer;

    return result;
  }